

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O3

string * __thiscall
solitaire::cards::to_string_abi_cxx11_(string *__return_storage_ptr__,cards *this,Value *value)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(uVar1) {
  case 0:
    pcVar3 = "Ace";
    pcVar2 = "";
    break;
  case 1:
    pcVar3 = "Two";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "Three";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "Four";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "Five";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "Six";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "Seven";
    pcVar2 = "";
    break;
  case 7:
    pcVar3 = "Eight";
    pcVar2 = "";
    break;
  case 8:
    pcVar3 = "Nine";
    pcVar2 = "";
    break;
  case 9:
    pcVar3 = "Ten";
    pcVar2 = "";
    break;
  case 10:
    pcVar3 = "Jack";
    pcVar2 = "";
    break;
  case 0xb:
    pcVar3 = "Queen";
    pcVar2 = "";
    break;
  case 0xc:
    pcVar3 = "King";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "Unknown";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Value& value) {
    switch(value) {
        case Value::Ace:
            return "Ace";
        case Value::Two:
            return "Two";
        case Value::Three:
            return "Three";
        case Value::Four:
            return "Four";
        case Value::Five:
            return "Five";
        case Value::Six:
            return "Six";
        case Value::Seven:
            return "Seven";
        case Value::Eight:
            return "Eight";
        case Value::Nine:
            return "Nine";
        case Value::Ten:
            return "Ten";
        case Value::Jack:
            return "Jack";
        case Value::Queen:
            return "Queen";
        case Value::King:
            return "King";
        default:
            return "Unknown";
    }
}